

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.h
# Opt level: O0

void __thiscall xmrig::SelfSelectClient::onLoginSuccess(SelfSelectClient *this,IClient *param_2)

{
  long in_RDI;
  SelfSelectClient *unaff_retaddr;
  long lVar1;
  
  lVar1 = in_RDI;
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))();
  setState(unaff_retaddr,(State)((ulong)lVar1 >> 0x20));
  *(undefined1 *)(in_RDI + 0x18) = 1;
  return;
}

Assistant:

inline void onLoginSuccess(IClient *) override                                                  { m_listener->onLoginSuccess(this); setState(IdleState); m_active = true; }